

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::ERROR(int line,string *type,string *sgn)

{
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  string local_200 [8];
  string o;
  allocator local_1c9;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *sgn_local;
  string *type_local;
  int line_local;
  
  local_20 = sgn;
  sgn_local = type;
  type_local._4_4_ = line;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"",&local_1c9);
  std::__cxx11::stringstream::str((string *)local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::ostream::operator<<(local_198,type_local._4_4_);
  std::__cxx11::string::string(local_200);
  std::operator>>((istream *)local_1a8,local_200);
  std::operator+((char *)local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error at Line ");
  std::operator+(local_280,(char *)local_2a0);
  std::operator+(local_260,local_280);
  std::operator+(local_240,(char *)local_260);
  std::operator+(local_220,local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)errVec_abi_cxx11_,local_220);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void ERROR(int line,string type,string sgn){
        stringstream ss;
        ss.str("");
        ss << line;
        string o;
        ss >> o;
        errVec.push_back("Error at Line "+o+": can't select "+type+" from "+sgn);
    }